

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::verifyRenderResult
          (LineRenderCase *this,IterationConfig *config)

{
  ostringstream *poVar1;
  uint uVar2;
  QueryDirection QVar3;
  int y;
  TypedObjectWrapper<(glu::ObjectType)3> *pTVar4;
  RenderContext *context;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  QueryDirection QVar12;
  QueryDirection QVar13;
  QueryDirection QVar14;
  QueryDirection QVar15;
  undefined4 extraout_var;
  RenderTarget *pRVar16;
  TestLog *pTVar17;
  QueryDirection QVar18;
  ConstPixelBufferAccess *pCVar19;
  QueryDirection QVar20;
  void *__buf;
  void *__buf_00;
  char *description;
  bool bVar21;
  qpTestResult testResult;
  char *pcVar22;
  ulong uVar23;
  int *messageLimitCounter_00;
  void *pvVar24;
  ulong uVar25;
  ulong uVar26;
  QueryDirection QVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  float size;
  int messageLimitCounter;
  Surface viewportSurface;
  IVec2 expectedVerticalLines;
  IVec2 expectedHorizontalLines;
  IVec4 viewportPatternArea;
  ProjectedBBox projectedBBox;
  IVec4 viewportBBoxArea;
  uint local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3b4;
  Surface local_3b0;
  long local_398;
  int local_38c;
  string local_388;
  undefined4 local_364;
  undefined4 local_360;
  uint local_35c;
  undefined1 local_358 [12];
  int local_34c;
  TextureFormat local_348;
  string local_340;
  string local_320;
  string local_300;
  undefined1 local_2e0 [64];
  undefined1 local_2a0 [16];
  undefined1 local_290 [24];
  LogImage local_278;
  ConstPixelBufferAccess local_1e8;
  undefined1 local_1c0 [120];
  ios_base local_148 [264];
  QueryDirection local_40;
  QueryDirection local_3c;
  QueryDirection local_38;
  QueryDirection local_34;
  
  iVar11 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  local_398 = CONCAT44(extraout_var,iVar11);
  pRVar16 = Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  local_38c = pRVar16->m_numSamples;
  projectBoundingBox(&config->bbox);
  if (this->m_isWideLineCase == false) {
    size = 1.0;
  }
  else {
    size = (float)this->m_wideLineLineWidth;
  }
  getViewportBoundingBoxArea
            ((anon_unknown_1 *)&local_40,(ProjectedBBox *)local_290,&config->viewportSize,size);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)local_2a0,&config->patternPos,&config->patternSize,
             &config->viewportSize,ROUND_INWARDS);
  QVar27 = (config->viewportSize).m_data[1];
  getNumberOfLinesRange
            ((LineRenderCase *)(local_358 + 8),(int)this,local_3c,(config->patternPos).m_data[1],
             (config->patternSize).m_data[1],local_34,QVar27);
  QVar3 = (config->viewportSize).m_data[0];
  getNumberOfLinesRange
            ((LineRenderCase *)local_358,(int)this,local_40,(config->patternPos).m_data[0],
             (config->patternSize).m_data[0],local_38,QVar3);
  QVar12 = DIRECTION_HORIZONTAL;
  if (0 < (int)local_40) {
    QVar12 = local_40;
  }
  QVar13 = DIRECTION_HORIZONTAL;
  if (0 < (int)local_3c) {
    QVar13 = local_3c;
  }
  QVar14 = QVar3;
  if ((int)local_38 < (int)QVar3) {
    QVar14 = local_38;
  }
  QVar15 = QVar27;
  if ((int)local_34 < (int)QVar27) {
    QVar15 = local_34;
  }
  tcu::Surface::Surface(&local_3b0,QVar3,QVar27);
  local_3b4 = 8;
  if ((this->super_BBoxRenderCase).m_calcPerPrimitiveBBox == false) {
    local_1c0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Projected bounding box: (clip space)\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::_M_insert<double>((double)(float)local_290._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)(float)local_290._12_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::_M_insert<double>((double)(float)local_290._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)(float)local_290._16_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz: [",5);
    std::ostream::_M_insert<double>((double)(float)local_290._8_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)(float)local_290._20_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"In viewport coordinates:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::operator<<(poVar1,local_40);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,local_38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::operator<<(poVar1,local_3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,local_34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying render results within the bounding box:\n",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
  }
  else {
    local_1c0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying render result:",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
  }
  local_1c0._0_8_ =
       ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t[",2);
  std::ostream::operator<<(poVar1,local_358._8_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_34c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] horizontal lines.\n",0x14)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t[",2);
  std::ostream::operator<<(poVar1,local_358._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_358._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] vertical lines.\n",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  pTVar4 = (this->super_BBoxRenderCase).m_fbo.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           .m_data.ptr;
  if (pTVar4 != (TypedObjectWrapper<(glu::ObjectType)3> *)0x0) {
    (**(code **)(local_398 + 0x78))(0x8ca8,(pTVar4->super_ObjectWrapper).m_object);
  }
  context = ((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx;
  iVar11 = (config->viewportPos).m_data[0];
  y = (config->viewportPos).m_data[1];
  local_278.m_name._M_dataplus._M_p = (undefined1 *)0x300000008;
  pvVar24 = (void *)local_3b0.m_pixels.m_cap;
  if ((void *)local_3b0.m_pixels.m_cap != (void *)0x0) {
    pvVar24 = local_3b0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1c0,(TextureFormat *)&local_278,local_3b0.m_width,
             local_3b0.m_height,1,pvVar24);
  glu::readPixels(context,iVar11,y,(PixelBufferAccess *)local_1c0);
  QVar27 = local_2a0._4_4_;
  if ((int)local_2a0._4_4_ < (int)QVar13) {
    QVar27 = QVar13;
  }
  QVar3 = local_2a0._12_4_;
  if ((int)QVar15 < (int)local_2a0._12_4_) {
    QVar3 = QVar15;
  }
  local_400 = 0;
  uVar26 = 0;
  uVar25 = 0;
  bVar7 = true;
  uVar23 = 0;
  bVar28 = false;
  if ((int)QVar27 < (int)QVar3) {
    QVar18 = local_2a0._0_4_;
    if ((int)local_2a0._0_4_ < (int)QVar12) {
      QVar18 = QVar12;
    }
    QVar20 = local_2a0._8_4_;
    if ((int)QVar14 < (int)local_2a0._8_4_) {
      QVar20 = QVar14;
    }
    local_3fc = 0;
    local_3f4 = 0;
    local_3f8 = 0;
    local_3d4 = 0;
    local_3d0 = 0;
    do {
      local_278.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar24 = (void *)local_3b0.m_pixels.m_cap;
      if ((void *)local_3b0.m_pixels.m_cap != (void *)0x0) {
        pvVar24 = local_3b0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1c0,(TextureFormat *)&local_278,local_3b0.m_width,
                 local_3b0.m_height,1,pvVar24);
      messageLimitCounter_00 = &local_3b4;
      local_278.m_name._M_dataplus._M_p._4_4_ = QVar27;
      local_278.m_name._M_dataplus._M_p._0_4_ = QVar12;
      local_278.m_name._M_string_length._4_4_ = 1;
      local_278.m_name._M_string_length._0_4_ = QVar14 - QVar12;
      bVar7 = checkAreaNumLines(this,(ConstPixelBufferAccess *)local_1c0,(IVec4 *)&local_278,
                                messageLimitCounter_00,1,(IVec2 *)local_358);
      local_398 = CONCAT71(local_398._1_7_,bVar7);
      local_2e0._0_4_ = QVar14;
      local_2e0._4_4_ = QVar27;
      bVar8 = checkLineWidths(this,(ConstPixelBufferAccess *)local_1c0,(IVec2 *)&local_278,
                              (IVec2 *)local_2e0,1,messageLimitCounter_00);
      local_278.m_name._M_dataplus._M_p._0_4_ = QVar18;
      local_2e0._0_4_ = QVar20;
      local_2e0._4_4_ = QVar27;
      bVar9 = checkLineContinuity(this,(ConstPixelBufferAccess *)local_1c0,(IVec2 *)&local_278,
                                  (IVec2 *)local_2e0,2,messageLimitCounter_00);
      if (bVar9 == 0) {
        bVar9 = 0x10;
      }
      if (bVar8 == 0) {
        bVar8 = 2;
      }
      bVar9 = bVar8 | (byte)local_398 | bVar9;
      if ((bVar9 & 0x10) == 0) {
        if ((bVar9 & 0x40) == 0) {
          local_3f8 = local_3f8 + 1;
        }
        else {
          local_3f4 = local_3f4 + 1;
        }
      }
      else if ((bVar9 & 2) == 0) {
        if ((local_38c < 2) || (this->m_isWideLineCase == false)) {
          if ((bVar9 & 0xc) == 4) {
            local_3d0 = local_3d0 + 1;
          }
          else {
            local_3d4 = local_3d4 + 1;
          }
        }
        else {
          local_3fc = local_3fc + 1;
        }
      }
      uVar2 = local_400 + (~(uint)bVar9 & 1);
      QVar27 = QVar27 + DIRECTION_VERTICAL;
      local_400 = uVar2;
    } while (QVar3 != QVar27);
    uVar26 = CONCAT71((int7)(uVar26 >> 8),local_3d4 != 0);
    uVar25 = CONCAT71((int7)(uVar25 >> 8),local_3f8 != 0);
    uVar23 = CONCAT71((int7)((ulong)messageLimitCounter_00 >> 8),local_3fc != 0);
    local_400 = (uint)(local_3d0 != 0);
    bVar7 = local_3f4 == 0;
    bVar28 = uVar2 != 0;
  }
  bVar10 = true;
  QVar27 = local_2a0._0_4_;
  if ((int)local_2a0._0_4_ < (int)QVar12) {
    QVar27 = QVar12;
  }
  QVar12 = local_2a0._8_4_;
  if ((int)QVar14 < (int)local_2a0._8_4_) {
    QVar12 = QVar14;
  }
  bVar29 = false;
  if ((int)QVar27 < (int)QVar12) {
    local_3c8 = 0;
    local_364 = (undefined4)uVar26;
    local_360 = (undefined4)uVar25;
    local_35c = (uint)uVar23;
    QVar14 = local_2a0._4_4_;
    if ((int)QVar13 < (int)local_2a0._4_4_) {
      QVar14 = QVar13;
    }
    local_3cc = 0;
    local_3fc = 0;
    local_3f8 = 0;
    local_3f4 = 0;
    iVar11 = 0;
    do {
      local_278.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar24 = (void *)local_3b0.m_pixels.m_cap;
      if ((void *)local_3b0.m_pixels.m_cap != (void *)0x0) {
        pvVar24 = local_3b0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1c0,(TextureFormat *)&local_278,local_3b0.m_width,
                 local_3b0.m_height,1,pvVar24);
      local_278.m_name._M_dataplus._M_p._4_4_ = QVar13;
      local_278.m_name._M_dataplus._M_p._0_4_ = QVar27;
      local_278.m_name._M_string_length._0_4_ = 1;
      local_278.m_name._M_string_length._4_4_ = QVar15 - QVar13;
      bVar10 = checkAreaNumLines(this,(ConstPixelBufferAccess *)local_1c0,(IVec4 *)&local_278,
                                 &local_3b4,2,(IVec2 *)(local_358 + 8));
      local_398 = CONCAT71(local_398._1_7_,bVar10);
      local_2e0._0_4_ = QVar27;
      local_2e0._4_4_ = QVar15;
      bVar8 = checkLineWidths(this,(ConstPixelBufferAccess *)local_1c0,(IVec2 *)&local_278,
                              (IVec2 *)local_2e0,2,&local_3b4);
      local_278.m_name._M_dataplus._M_p._4_4_ = QVar14;
      local_2e0._0_4_ = QVar27;
      local_2e0._4_4_ = QVar3;
      bVar9 = checkLineContinuity(this,(ConstPixelBufferAccess *)local_1c0,(IVec2 *)&local_278,
                                  (IVec2 *)local_2e0,1,&local_3b4);
      if (bVar9 == 0) {
        bVar9 = 0x10;
      }
      if (bVar8 == 0) {
        bVar8 = 2;
      }
      bVar9 = bVar8 | (byte)local_398 | bVar9;
      if ((bVar9 & 0x10) == 0) {
        if ((bVar9 & 0x40) == 0) {
          local_3cc = local_3cc + 1;
        }
        else {
          local_3c8 = local_3c8 + 1;
        }
      }
      else if ((bVar9 & 2) == 0) {
        if ((local_38c < 2) || (this->m_isWideLineCase == false)) {
          if ((bVar9 & 0xc) == 4) {
            local_3f8 = local_3f8 + 1;
          }
          else {
            local_3fc = local_3fc + 1;
          }
        }
        else {
          local_3f4 = local_3f4 + 1;
        }
      }
      iVar11 = iVar11 + (~(uint)bVar9 & 1);
      QVar27 = QVar27 + DIRECTION_VERTICAL;
    } while (QVar12 != QVar27);
    bVar29 = local_3f4 != 0;
    bVar30 = local_3f8 != 0;
    bVar10 = iVar11 == 0;
    bVar31 = local_3c8 == 0;
    uVar26 = (ulong)(local_3fc != 0 | (byte)local_364);
    uVar25 = (ulong)(local_3cc != 0 | (byte)local_360);
    uVar23 = (ulong)local_35c;
  }
  else {
    bVar30 = false;
    bVar31 = true;
  }
  iVar11 = local_3b4;
  bVar21 = true;
  bVar5 = false;
  bVar6 = false;
  if ((uVar26 & 1) == 0) {
    bVar8 = 0;
    if ((uVar25 & 1) != 0) goto LAB_0167d709;
    if (!bVar29 && (uVar23 & 1) == 0) {
      if (bVar30 || local_400 != 0) {
        bVar8 = 1;
        bVar5 = false;
        bVar21 = false;
      }
      else if (bVar10) {
        bVar8 = (bVar31 ^ 1U) & bVar28;
        bVar5 = false;
        bVar21 = (bool)(bVar28 & bVar31);
      }
      else {
        bVar8 = bVar7 ^ 1;
        bVar5 = false;
        bVar21 = bVar7;
      }
      goto LAB_0167d709;
    }
    bVar21 = false;
    bVar6 = true;
  }
  bVar5 = bVar6;
  bVar8 = 0;
LAB_0167d709:
  if (((bVar21 != false) || (bVar5)) || (bVar8 != 0)) {
    if (local_3b4 < 0) {
      local_1c0._0_8_ =
           ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
      poVar1 = (ostringstream *)(local_1c0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
      std::ostream::operator<<(poVar1,-iVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," row/column error descriptions.",0x1f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_148);
    }
    local_1c0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c0 + 8),"Image verification failed.",0x1a);
    pTVar17 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Images","");
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Image verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_2e0,&local_300,&local_320);
    tcu::TestLog::startImageSet
              (pTVar17,(char *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_),(char *)local_2e0._32_8_);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Viewport","");
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Viewport contents","");
    local_348.order = RGBA;
    local_348.type = UNORM_INT8;
    if ((void *)local_3b0.m_pixels.m_cap != (void *)0x0) {
      local_3b0.m_pixels.m_cap = (size_t)local_3b0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_1e8,&local_348,local_3b0.m_width,local_3b0.m_height,1,
               (void *)local_3b0.m_pixels.m_cap);
    pCVar19 = &local_1e8;
    tcu::LogImage::LogImage(&local_278,&local_388,&local_340,pCVar19,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_278,(int)pTVar17,__buf_00,(size_t)pCVar19);
    tcu::TestLog::endImageSet(pTVar17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_description._M_dataplus._M_p != &local_278.m_description.field_2) {
      operator_delete(local_278.m_description._M_dataplus._M_p,
                      local_278.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_name._M_dataplus._M_p != &local_278.m_name.field_2) {
      operator_delete(local_278.m_name._M_dataplus._M_p,
                      local_278.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((TypedObjectWrapper<(glu::ObjectType)1> *)local_2e0._32_8_ !=
        (TypedObjectWrapper<(glu::ObjectType)1> *)(local_2e0 + 0x30)) {
      operator_delete((void *)local_2e0._32_8_,(ulong)(local_2e0._48_8_ + 1));
    }
    if ((undefined1 *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_) != local_2e0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_),
                      (ulong)(local_2e0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c0 + 8));
    std::ios_base::~ios_base(local_148);
    pcVar22 = "Multisampled wide line verification failed";
    if (bVar8 != 0) {
      pcVar22 = "Line width verification failed";
    }
    testResult = QP_TEST_RESULT_FAIL;
    if (bVar21 == false) {
      testResult = bVar8 ^ QP_TEST_RESULT_COMPATIBILITY_WARNING;
    }
    description = "Image verification failed";
    if (bVar21 == false) {
      description = pcVar22;
    }
    tcu::TestContext::setTestResult
              ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               testResult,description);
  }
  else {
    local_1c0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Result image ok.",0x10);
    pTVar17 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Images","");
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Image verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_2e0,&local_300,&local_320);
    tcu::TestLog::startImageSet
              (pTVar17,(char *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_),(char *)local_2e0._32_8_);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Viewport","");
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Viewport contents","");
    local_348.order = RGBA;
    local_348.type = UNORM_INT8;
    if ((void *)local_3b0.m_pixels.m_cap != (void *)0x0) {
      local_3b0.m_pixels.m_cap = (size_t)local_3b0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_1e8,&local_348,local_3b0.m_width,local_3b0.m_height,1,
               (void *)local_3b0.m_pixels.m_cap);
    pCVar19 = &local_1e8;
    tcu::LogImage::LogImage(&local_278,&local_388,&local_340,pCVar19,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_278,(int)pTVar17,__buf,(size_t)pCVar19);
    tcu::TestLog::endImageSet(pTVar17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_description._M_dataplus._M_p != &local_278.m_description.field_2) {
      operator_delete(local_278.m_description._M_dataplus._M_p,
                      local_278.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_name._M_dataplus._M_p != &local_278.m_name.field_2) {
      operator_delete(local_278.m_name._M_dataplus._M_p,
                      local_278.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((TypedObjectWrapper<(glu::ObjectType)1> *)local_2e0._32_8_ !=
        (TypedObjectWrapper<(glu::ObjectType)1> *)(local_2e0 + 0x30)) {
      operator_delete((void *)local_2e0._32_8_,(ulong)(local_2e0._48_8_ + 1));
    }
    if ((undefined1 *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_) != local_2e0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_),
                      (ulong)(local_2e0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
  }
  tcu::Surface::~Surface(&local_3b0);
  return;
}

Assistant:

void LineRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl							= m_context.getRenderContext().getFunctions();
	const bool				isMsaa						= m_context.getRenderTarget().getNumSamples() > 1;
	const ProjectedBBox		projectedBBox				= projectBoundingBox(config.bbox);
	const float				lineWidth					= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);
	const tcu::IVec4		viewportBBoxArea			= getViewportBoundingBoxArea(projectedBBox, config.viewportSize, lineWidth);
	const tcu::IVec4		viewportPatternArea			= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	const tcu::IVec2		expectedHorizontalLines		= getNumberOfLinesRange(viewportBBoxArea.y(), viewportBBoxArea.w(), config.patternPos.y(), config.patternSize.y(), config.viewportSize.y(), DIRECTION_VERTICAL);
	const tcu::IVec2		expectedVerticalLines		= getNumberOfLinesRange(viewportBBoxArea.x(), viewportBBoxArea.z(), config.patternPos.x(), config.patternSize.x(), config.viewportSize.x(), DIRECTION_HORIZONTAL);
	const tcu::IVec4		verificationArea			= tcu::IVec4(de::max(viewportBBoxArea.x(), 0),
																	 de::max(viewportBBoxArea.y(), 0),
																	 de::min(viewportBBoxArea.z(), config.viewportSize.x()),
																	 de::min(viewportBBoxArea.w(), config.viewportSize.y()));

	tcu::Surface			viewportSurface				(config.viewportSize.x(), config.viewportSize.y());
	int						messageLimitCounter			= 8;

	enum ScanResultCodes
	{
		SCANRESULT_NUM_LINES_ERR	= 0,
		SCANRESULT_LINE_WIDTH_MSAA	= 1,
		SCANRESULT_LINE_WIDTH_WARN	= 2,
		SCANRESULT_LINE_WIDTH_ERR	= 3,
		SCANRESULT_LINE_CONT_ERR	= 4,
		SCANRESULT_LINE_CONT_WARN	= 5,
		SCANRESULT_LINE_LAST
	};

	int						rowScanResult[SCANRESULT_LINE_LAST]		= {0, 0, 0, 0, 0, 0};
	int						columnScanResult[SCANRESULT_LINE_LAST]	= {0, 0, 0, 0, 0, 0};
	bool					anyError								= false;
	bool					msaaRelaxationRequired					= false;
	bool					hwIssueRelaxationRequired				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box:\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result:"
			<< tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
			<< "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
			<< "\t[" << expectedHorizontalLines.x() << ", " << expectedHorizontalLines.y() << "] horizontal lines.\n"
			<< "\t[" << expectedVerticalLines.x() << ", " << expectedVerticalLines.y() << "] vertical lines.\n"
		<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	// scan rows
	for (int y = de::max(verificationArea.y(), viewportPatternArea.y()); y < de::min(verificationArea.w(), viewportPatternArea.w()); ++y)
	{
		const deUint8 result = scanRow(viewportSurface.getAccess(),
									   y,
									   verificationArea.x(),
									   verificationArea.z(),
									   de::max(verificationArea.x(), viewportPatternArea.x()),
									   de::min(verificationArea.z(), viewportPatternArea.z()),
									   expectedVerticalLines,
									   messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			rowScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				rowScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				rowScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				rowScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				rowScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				rowScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	// scan columns
	for (int x = de::max(verificationArea.x(), viewportPatternArea.x()); x < de::min(verificationArea.z(), viewportPatternArea.z()); ++x)
	{
		const deUint8 result = scanColumn(viewportSurface.getAccess(),
										  x,
										  verificationArea.y(),
										  verificationArea.w(),
										  de::min(verificationArea.y(), viewportPatternArea.y()),
										  de::min(verificationArea.w(), viewportPatternArea.w()),
										  expectedHorizontalLines,
										  messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			columnScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				columnScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				columnScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				columnScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				columnScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				columnScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	if (columnScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0)
		anyError = true;
	else if(columnScanResult[SCANRESULT_LINE_CONT_ERR] != 0 || rowScanResult[SCANRESULT_LINE_CONT_ERR] != 0)
		anyError = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0)
		msaaRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0)
		hwIssueRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a columnw and row line continuity check reported a warning (not an error) -> line width precision issue
		if (rowScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && rowScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}
	else if (rowScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a row and column line continuity check reported a warning (not an error) -> line width precision issue
		if (columnScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && columnScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}

	if (anyError || msaaRelaxationRequired || hwIssueRelaxationRequired)
	{
		if (messageLimitCounter < 0)
			m_testCtx.getLog() << tcu::TestLog::Message << "Omitted " << (-messageLimitCounter) << " row/column error descriptions." << tcu::TestLog::EndMessage;

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		if (anyError)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
		else if (hwIssueRelaxationRequired)
		{
			// Line width hw issue
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Line width verification failed");
		}
		else
		{
			// MSAA wide lines are optional
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Multisampled wide line verification failed");
		}
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}